

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

bool vkt::sparse::checkSparseSupportForImageType
               (InstanceInterface *instance,VkPhysicalDevice physicalDevice,ImageType imageType)

{
  bool bVar1;
  VkPhysicalDeviceFeatures deviceFeatures;
  
  ::vk::getPhysicalDeviceFeatures(&deviceFeatures,instance,physicalDevice);
  if (deviceFeatures.sparseBinding == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if ((imageType < IMAGE_TYPE_BUFFER) &&
       (((0x6cU >> (imageType & 0x1f) & 1) != 0 ||
        (bVar1 = false,
        deviceFeatures.sparseResidencyImage2D = deviceFeatures.sparseResidencyImage3D,
        imageType == IMAGE_TYPE_3D)))) {
      bVar1 = deviceFeatures.sparseResidencyImage2D == 1;
    }
  }
  return bVar1;
}

Assistant:

bool checkSparseSupportForImageType (const InstanceInterface&	instance,
									 const VkPhysicalDevice		physicalDevice,
									 const ImageType			imageType)
{
	const VkPhysicalDeviceFeatures deviceFeatures = getPhysicalDeviceFeatures(instance, physicalDevice);

	if (!deviceFeatures.sparseBinding)
		return false;

	switch (mapImageType(imageType))
	{
		case VK_IMAGE_TYPE_2D:
			return deviceFeatures.sparseResidencyImage2D == VK_TRUE;
		case VK_IMAGE_TYPE_3D:
			return deviceFeatures.sparseResidencyImage3D == VK_TRUE;
		default:
			DE_ASSERT(0);
			return false;
	};
}